

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

Vec_Str_t * Super_WriteLibraryTreeStr(Super_Man_t *pMan)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  uint local_40;
  int posStart;
  int Counter;
  int i;
  Super_Gate_t_conflict *pSuper;
  Vec_Str_t *vStr;
  char pInsert [16];
  Super_Man_t *pMan_local;
  
  pSuper = (Super_Gate_t_conflict *)Vec_StrAlloc(1000);
  Super_WriteFileHeaderStr(pMan,(Vec_Str_t *)pSuper);
  iVar2 = Vec_StrSize((Vec_Str_t *)pSuper);
  for (posStart = 0; posStart < 9; posStart = posStart + 1) {
    Vec_StrPush((Vec_Str_t *)pSuper,' ');
  }
  Vec_StrPush((Vec_Str_t *)pSuper,'\n');
  posStart = 0;
  while( true ) {
    bVar4 = false;
    if (posStart < pMan->nGates) {
      _Counter = pMan->pGates[posStart];
      bVar4 = _Counter != (Super_Gate_t_conflict *)0x0;
    }
    if (!bVar4) break;
    *(uint *)&_Counter->field_0x8 = *(uint *)&_Counter->field_0x8 & 0xfffffffd | 2;
    posStart = posStart + 1;
  }
  local_40 = pMan->nVarsMax;
  posStart = 0;
  while( true ) {
    bVar4 = false;
    if (posStart < pMan->nGates) {
      _Counter = pMan->pGates[posStart];
      bVar4 = _Counter != (Super_Gate_t_conflict *)0x0;
    }
    if (!bVar4) break;
    Super_WriteLibraryTreeStr_rec((Vec_Str_t *)pSuper,pMan,_Counter,(int *)&local_40);
    posStart = posStart + 1;
  }
  Vec_StrPush((Vec_Str_t *)pSuper,'\0');
  sprintf((char *)&vStr,"%d",(ulong)local_40);
  posStart = 0;
  while( true ) {
    iVar1 = posStart;
    sVar3 = strlen((char *)&vStr);
    if ((int)sVar3 <= iVar1) break;
    Vec_StrWriteEntry((Vec_Str_t *)pSuper,iVar2 + posStart,pInsert[(long)posStart + -8]);
    posStart = posStart + 1;
  }
  return (Vec_Str_t *)pSuper;
}

Assistant:

Vec_Str_t * Super_WriteLibraryTreeStr( Super_Man_t * pMan )
{
    char pInsert[16];
    Vec_Str_t * vStr;
    Super_Gate_t * pSuper;
    int i, Counter;
    int posStart;
     // write the elementary variables
    vStr = Vec_StrAlloc( 1000 );
    Super_WriteFileHeaderStr( pMan, vStr );
    // write the place holder for the number of lines
    posStart = Vec_StrSize( vStr );
    for ( i = 0; i < 9; i++ )
        Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '\n' );
    // mark the real supergates
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pSuper )
        pSuper->fSuper = 1;
    // write the supergates
    Counter = pMan->nVarsMax;
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pSuper )
        Super_WriteLibraryTreeStr_rec( vStr, pMan, pSuper, &Counter );
    Vec_StrPush( vStr, 0 );
    // write the number of lines
    sprintf( pInsert, "%d", Counter );
    for ( i = 0; i < (int)strlen(pInsert); i++ )
        Vec_StrWriteEntry( vStr, posStart + i, pInsert[i] );
    return vStr;
}